

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.hxx
# Opt level: O0

future<void> __thiscall
ThreadPool::submit<void(&)(int,int,int),int&,int&,int&>
          (ThreadPool *this,_func_void_int_int_int *f,int *args,int *args_1,int *args_2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  future<void> fVar1;
  unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_> local_68 [3];
  future<void> future;
  __single_object wi_ptr;
  int *args_local_2;
  int *args_local_1;
  int *args_local;
  _func_void_int_int_int *f_local;
  ThreadPool *this_local;
  
  this_00 = &future.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::
  make_unique<WorkItem<void(&)(int,int,int),int&,int&,int&>,void(&)(int,int,int),int&,int&,int&>
            ((_func_void_int_int_int *)this_00,args,args_1,args_2);
  std::
  unique_ptr<WorkItem<void_(&)(int,_int,_int),_int_&,_int_&,_int_&>,_std::default_delete<WorkItem<void_(&)(int,_int,_int),_int_&,_int_&,_int_&>_>_>
  ::operator->((unique_ptr<WorkItem<void_(&)(int,_int,_int),_int_&,_int_&,_int_&>,_std::default_delete<WorkItem<void_(&)(int,_int,_int),_int_&,_int_&,_int_&>_>_>
                *)this_00);
  WorkItem<void_(&)(int,_int,_int),_int_&,_int_&,_int_&>::get_future
            ((WorkItem<void_(&)(int,_int,_int),_int_&,_int_&,_int_&> *)&stack0xffffffffffffffb0);
  std::unique_ptr<AbstractWorkItem,std::default_delete<AbstractWorkItem>>::
  unique_ptr<WorkItem<void(&)(int,int,int),int&,int&,int&>,std::default_delete<WorkItem<void(&)(int,int,int),int&,int&,int&>>,void>
            ((unique_ptr<AbstractWorkItem,std::default_delete<AbstractWorkItem>> *)local_68,
             (unique_ptr<WorkItem<void_(&)(int,_int,_int),_int_&,_int_&,_int_&>,_std::default_delete<WorkItem<void_(&)(int,_int,_int),_int_&,_int_&,_int_&>_>_>
              *)&future.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
  WorkItemScheduler::submit((unique_ptr *)f);
  std::unique_ptr<AbstractWorkItem,_std::default_delete<AbstractWorkItem>_>::~unique_ptr(local_68);
  std::future<void>::future((future<void> *)this,(future<void> *)&stack0xffffffffffffffb0);
  std::future<void>::~future((future<void> *)&stack0xffffffffffffffb0);
  std::
  unique_ptr<WorkItem<void_(&)(int,_int,_int),_int_&,_int_&,_int_&>,_std::default_delete<WorkItem<void_(&)(int,_int,_int),_int_&,_int_&,_int_&>_>_>
  ::~unique_ptr((unique_ptr<WorkItem<void_(&)(int,_int,_int),_int_&,_int_&,_int_&>,_std::default_delete<WorkItem<void_(&)(int,_int,_int),_int_&,_int_&,_int_&>_>_>
                 *)&future.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  fVar1.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  fVar1.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<void>)
         fVar1.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto ThreadPool::submit(Function&& f, Args&&... args)
{
    auto wi_ptr = std::make_unique<WorkItem<Function, Args...>>(f, args...);
    auto future = wi_ptr->get_future();
    this->sched_.submit(std::move(wi_ptr));

    return future;
}